

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testselectionwidget.cpp
# Opt level: O2

void freehand_create_proc(Am_Object *cmd)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  ulong uVar7;
  Am_Wrapper *pAVar8;
  Am_Object *pAVar9;
  ostream *poVar10;
  Am_Object new_object;
  Am_Object inter;
  Am_Object parent_cmd;
  Am_Object local_50;
  Am_Object local_48;
  Am_Style color;
  Am_Object local_38;
  Am_Inter_Location data;
  
  inter.data = (Am_Object_Data *)0x0;
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)cmd,0x170);
  Am_Object::operator=(&inter,pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x138);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x13a);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x139);
  iVar4 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&inter,0x13b);
  iVar5 = Am_Value::operator_cast_to_int(pAVar6);
  Am_Object::Get_Owner(&local_38,(Am_Slot_Flags)&inter);
  Am_Inter_Location::Am_Inter_Location
            (&data,false,(Am_Object_Data *)&local_38,iVar2,iVar3,iVar4 - iVar2,iVar5 - iVar3,true,
             true);
  Am_Object::~Am_Object(&local_38);
  Am_Object::Get_Object((ushort)&new_object,0x1156f0);
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)&new_object,0x6a);
  Am_Style::Am_Style(&color,pAVar6);
  Am_Object::~Am_Object(&new_object);
  Am_Object::Create((char *)&parent_cmd);
  uVar7 = Am_Object::Get((ushort)&inter,0xb2);
  uVar1 = Am_Object::Set((ushort)&parent_cmd,(Am_Value *)0xb2,uVar7);
  pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&color);
  pAVar9 = (Am_Object *)Am_Object::Set(uVar1,(Am_Wrapper *)0x6b,(ulong)pAVar8);
  Am_Object::Am_Object(&new_object,pAVar9);
  Am_Object::~Am_Object(&parent_cmd);
  Am_Object::Am_Object(&local_48,&new_object);
  Am_Object::Add_Part((Am_Object)0x115688,SUB81(&local_48,0),1);
  Am_Object::~Am_Object(&local_48);
  Set_LTWH_Anims_On(&new_object,0x6b,true);
  poVar10 = std::operator<<((ostream *)&std::cout,"\n--++-- Created new freehand ");
  poVar10 = (ostream *)operator<<(poVar10,&new_object);
  poVar10 = std::operator<<(poVar10," at (");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar2);
  poVar10 = std::operator<<(poVar10,",");
  poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar3);
  std::operator<<(poVar10,")\n");
  std::ostream::flush();
  parent_cmd.data = (Am_Object_Data *)0x0;
  pAVar6 = (Am_Value *)Am_Object::Get((ushort)cmd,0x154);
  Am_Object::operator=(&parent_cmd,pAVar6);
  uVar1 = Am_Object::Set((ushort)&parent_cmd,0x154,0);
  pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&create_inter);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x170,(ulong)pAVar8);
  pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x16d,(ulong)pAVar8);
  Am_Object::Copy((char *)&local_50);
  pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&local_50);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x11a,(ulong)pAVar8);
  pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&new_object);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x169,(ulong)pAVar8);
  uVar1 = Am_Object::Set(uVar1,true,1);
  pAVar8 = Am_Inter_Location::operator_cast_to_Am_Wrapper_(&data);
  uVar1 = Am_Object::Set(uVar1,(Am_Wrapper *)0x16a,(ulong)pAVar8);
  Am_Object::Set(uVar1,true,0);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&parent_cmd);
  Am_Object::~Am_Object(&new_object);
  Am_Style::~Am_Style(&color);
  Am_Inter_Location::~Am_Inter_Location(&data);
  Am_Object::~Am_Object(&inter);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, freehand_create, (Am_Object cmd))
{
  Am_Object inter;
  inter = cmd.Get(Am_SAVED_OLD_OWNER);
  int left = inter.Get(Am_MIN_X);
  int top = inter.Get(Am_MIN_Y);
  int width = (int)inter.Get(Am_MAX_X) - left;
  int height = (int)inter.Get(Am_MAX_Y) - top;
  Am_Inter_Location data(false, inter.Get_Owner(), left, top, width, height);

  Am_Style color = color_panel.Get_Object(Am_VALUE).Get(Am_FILL_STYLE);

  Am_Object new_object = freehand_line_proto.Create()
                             .Set(Am_POINT_LIST, inter.Get(Am_POINT_LIST))
                             .Set(Am_LINE_STYLE, color);
  created_objs.Add_Part(new_object);

  Set_LTWH_Anims_On(new_object, Am_LINE_STYLE, true);

  std::cout << "\n--++-- Created new freehand " << new_object << " at (" << left
            << "," << top << ")\n"
            << std::flush;

  // Set appropriate slots in implementation parent (to be called next).
  // This parent command is actually the New_Points_Interactor's
  // implementation command.
  Am_Object parent_cmd;
  parent_cmd = cmd.Get(Am_IMPLEMENTATION_PARENT);
  parent_cmd.Set(Am_IMPLEMENTATION_PARENT, 0)
      .Set(Am_SAVED_OLD_OWNER, create_inter, Am_OK_IF_NOT_THERE)
      .Set(Am_OBJECT_MODIFIED, new_object)
      .Set(Am_START_OBJECT, new_object.Copy())
      .Set(Am_VALUE, new_object)
      .Set(Am_AS_LINE, true)
      .Set(Am_INTERIM_VALUE, data)
      .Set(Am_HAS_BEEN_UNDONE, false);
}